

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::handle_vote_resp(raft_server *this,resp_msg *resp)

{
  bool bVar1;
  srv_role sVar2;
  uint uVar3;
  uint uVar4;
  element_type *peVar5;
  char *pcVar6;
  int iVar7;
  int32 iVar8;
  uint uVar9;
  undefined1 *puVar10;
  undefined8 local_70;
  undefined1 local_68;
  undefined1 local_67 [7];
  string local_60;
  uint local_3c;
  ulong local_38;
  
  if (this->election_completed_ == true) {
    peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar5 == (element_type *)0x0) {
      return;
    }
    iVar7 = (**(code **)(*(long *)peVar5 + 0x38))();
    if (iVar7 < 4) {
      return;
    }
    peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (&local_60,"Election completed, will ignore the voting result from this server");
    (**(code **)(*(long *)peVar5 + 0x40))
              (peVar5,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
               ,"handle_vote_resp",0x164,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return;
    }
  }
  else {
    if ((resp->super_msg_base).term_ !=
        (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        term_).super___atomic_base<unsigned_long>._M_i) {
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar5 == (element_type *)0x0) {
        return;
      }
      iVar7 = (**(code **)(*(long *)peVar5 + 0x38))();
      if (iVar7 < 4) {
        return;
      }
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar3 = (resp->super_msg_base).src_;
      sVar2 = (this->role_)._M_i;
      if (sVar2 == leader) {
        puVar10 = (undefined1 *)((long)&local_70 + 6);
        local_70 = CONCAT26(local_70._6_2_,0x726500000000);
        local_70 = CONCAT44(local_70._4_4_,0x6461656c);
      }
      else if (sVar2 == candidate) {
        puVar10 = local_67;
        local_70 = 0x74616469646e6163;
        local_68 = 0x65;
      }
      else if (sVar2 == follower) {
        puVar10 = &local_68;
        local_70 = 0x7265776f6c6c6f66;
      }
      else {
        puVar10 = (undefined1 *)((long)&local_70 + 7);
        local_70 = CONCAT17(local_70._7_1_,0x4e574f4e000000);
        local_70 = CONCAT44(local_70._4_4_,0x4e4b4e55);
      }
      *puVar10 = 0;
      msg_if_given_abi_cxx11_
                (&local_60,
                 "[VOTE RESP] from peer %d, my role %s, but different resp term %lu. ignore it.",
                 (ulong)uVar3,&local_70,(resp->super_msg_base).term_);
      (**(code **)(*(long *)peVar5 + 0x40))
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"handle_vote_resp",0x16c,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return;
      }
      operator_delete(local_60._M_dataplus._M_p);
      return;
    }
    iVar7 = this->votes_responded_ + 1;
    this->votes_responded_ = iVar7;
    if (resp->accepted_ == true) {
      this->votes_granted_ = this->votes_granted_ + 1;
    }
    iVar8 = get_num_voting_members(this);
    if (iVar8 <= iVar7) {
      this->election_completed_ = true;
    }
    iVar8 = get_quorum_for_election(this);
    peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar5 != (element_type *)0x0) &&
       (iVar7 = (**(code **)(*(long *)peVar5 + 0x38))(), 3 < iVar7)) {
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_3c = (resp->super_msg_base).src_;
      bVar1 = resp->accepted_;
      local_38 = (resp->super_msg_base).term_;
      sVar2 = (this->role_)._M_i;
      if (sVar2 == leader) {
        puVar10 = (undefined1 *)((long)&local_70 + 6);
        local_70 = CONCAT26(local_70._6_2_,0x726500000000);
        local_70 = CONCAT44(local_70._4_4_,0x6461656c);
      }
      else if (sVar2 == candidate) {
        puVar10 = local_67;
        local_70 = 0x74616469646e6163;
        local_68 = 0x65;
      }
      else if (sVar2 == follower) {
        puVar10 = &local_68;
        local_70 = 0x7265776f6c6c6f66;
      }
      else {
        puVar10 = (undefined1 *)((long)&local_70 + 7);
        local_70 = CONCAT17(local_70._7_1_,0x4e574f4e000000);
        local_70 = CONCAT44(local_70._4_4_,0x4e4b4e55);
      }
      *puVar10 = 0;
      uVar3 = this->votes_responded_;
      uVar4 = this->votes_granted_;
      uVar9 = get_num_voting_members(this);
      pcVar6 = "XX";
      if (bVar1 != false) {
        pcVar6 = "NO";
      }
      msg_if_given_abi_cxx11_
                (&local_60,
                 "[VOTE RESP] peer %d (%s), resp term %lu, my role %s, granted %d, responded %d, num voting members %d, quorum %d\n"
                 ,(ulong)local_3c,pcVar6 + 1,local_38,&local_70,(ulong)uVar4,(ulong)uVar3,
                 (ulong)uVar9,(ulong)(iVar8 + 1));
      (**(code **)(*(long *)peVar5 + 0x40))
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"handle_vote_resp",0x181,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
    if (this->votes_granted_ <= iVar8) {
      return;
    }
    peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar5 != (element_type *)0x0) &&
       (iVar7 = (**(code **)(*(long *)peVar5 + 0x38))(), 3 < iVar7)) {
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_60,"Server is elected as leader for term %lu",
                 (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i);
      (**(code **)(*(long *)peVar5 + 0x40))
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"handle_vote_resp",0x184,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
    this->election_completed_ = true;
    become_leader(this);
    peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar5 == (element_type *)0x0) {
      return;
    }
    iVar7 = (**(code **)(*(long *)peVar5 + 0x38))();
    if (iVar7 < 4) {
      return;
    }
    peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (&local_60,"  === LEADER (term %lu) ===\n",
               (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i);
    (**(code **)(*(long *)peVar5 + 0x40))
              (peVar5,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
               ,"handle_vote_resp",0x187,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return;
    }
  }
  operator_delete(local_60._M_dataplus._M_p);
  return;
}

Assistant:

void raft_server::handle_vote_resp(resp_msg& resp) {
    if (election_completed_) {
        p_in("Election completed, will ignore the voting result from this server");
        return;
    }

    if (resp.get_term() != state_->get_term()) {
        // Vote response for other term. Should ignore it.
        p_in("[VOTE RESP] from peer %d, my role %s, "
             "but different resp term %" PRIu64 ". ignore it.",
             resp.get_src(), srv_role_to_string(role_).c_str(), resp.get_term());
        return;
    }
    votes_responded_ += 1;

    if (resp.get_accepted()) {
        votes_granted_ += 1;
    }

    if (votes_responded_ >= get_num_voting_members()) {
        election_completed_ = true;
    }

    int32 election_quorum_size = get_quorum_for_election() + 1;

    p_in("[VOTE RESP] peer %d (%s), resp term %" PRIu64 ", my role %s, "
         "granted %d, responded %d, "
         "num voting members %d, quorum %d\n",
         resp.get_src(), (resp.get_accepted()) ? "O" : "X", resp.get_term(),
         srv_role_to_string(role_).c_str(),
         (int)votes_granted_, (int)votes_responded_,
         get_num_voting_members(), election_quorum_size);

    if (votes_granted_ >= election_quorum_size) {
        p_in("Server is elected as leader for term %" PRIu64, state_->get_term());
        election_completed_ = true;
        become_leader();
        p_in("  === LEADER (term %" PRIu64 ") ===\n", state_->get_term());
    }
}